

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::plot
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,char *filename)

{
  size_t sVar1;
  ostream *poVar2;
  undefined8 uVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  char *pcVar8;
  string local_400 [32];
  size_type local_3e0;
  size_t j;
  size_t i;
  stringstream local_3a0 [8];
  stringstream gnuplot_script;
  ostream local_390 [376];
  ostream local_218 [8];
  ofstream out;
  char *filename_local;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this_local;
  
  std::ofstream::ofstream(local_218);
  std::__cxx11::stringstream::stringstream(local_3a0);
  poVar2 = std::operator<<(local_390,filename);
  std::operator<<(poVar2,"_GnuplotScript");
  std::__cxx11::stringstream::str();
  uVar3 = std::__cxx11::string::c_str();
  std::ofstream::open(local_218,uVar3,0x10);
  std::__cxx11::string::~string((string *)&i);
  poVar2 = std::operator<<(local_218,"plot      \'-\' matrix with image");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  j = 0;
  while( true ) {
    sVar1 = j;
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->heat_map);
    if (sVar1 == sVar4) break;
    local_3e0 = 0;
    while( true ) {
      sVar4 = local_3e0;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->heat_map,j);
      sVar6 = std::vector<double,_std::allocator<double>_>::size(pvVar5);
      if (sVar4 == sVar6) break;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->heat_map,j);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,local_3e0);
      poVar2 = (ostream *)std::ostream::operator<<(local_218,*pvVar7);
      std::operator<<(poVar2," ");
      local_3e0 = local_3e0 + 1;
    }
    std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
    j = j + 1;
  }
  std::ofstream::close();
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
                          );
  std::__cxx11::stringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar8);
  poVar2 = std::operator<<(poVar2,"\'\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_400);
  std::__cxx11::stringstream::~stringstream(local_3a0);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::plot(const char* filename) const {
  std::ofstream out;
  std::stringstream gnuplot_script;
  gnuplot_script << filename << "_GnuplotScript";

  out.open(gnuplot_script.str().c_str());
  out << "plot      '-' matrix with image" << std::endl;
  for (size_t i = 0; i != this->heat_map.size(); ++i) {
    for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
      out << this->heat_map[i][j] << " ";
    }
    out << std::endl;
  }
  out.close();
  std::clog << "To visualize, install gnuplot and type the command: gnuplot -persist -e \"load \'"
            << gnuplot_script.str().c_str() << "\'\"" << std::endl;
}